

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,bool once)

{
  xpath_value_type xVar1;
  size_t sVar2;
  size_t in_RDX;
  xpath_node_set_raw *in_RSI;
  long in_RDI;
  size_t in_stack_00000038;
  xpath_node_set_raw *in_stack_00000040;
  
  sVar2 = xpath_node_set_raw::size(in_RSI);
  if (sVar2 != in_RDX) {
    if ((*(char *)(in_RDI + 3) == '\x02') || (*(char *)(in_RDI + 3) == '\x03')) {
      apply_predicate_number_const(in_stack_00000040,in_stack_00000038,this,(xpath_stack *)ns);
    }
    else {
      xVar1 = rettype(*(xpath_ast_node **)(in_RDI + 0x10));
      if (xVar1 == xpath_type_number) {
        apply_predicate_number
                  ((xpath_node_set_raw *)this,(size_t)ns,(xpath_ast_node *)first,stack,once);
      }
      else {
        apply_predicate_boolean
                  ((xpath_node_set_raw *)this,(size_t)ns,(xpath_ast_node *)first,stack,once);
      }
    }
  }
  return;
}

Assistant:

void apply_predicate(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, bool once)
		{
			if (ns.size() == first) return;

			assert(_type == ast_filter || _type == ast_predicate);

			if (_test == predicate_constant || _test == predicate_constant_one)
				apply_predicate_number_const(ns, first, _right, stack);
			else if (_right->rettype() == xpath_type_number)
				apply_predicate_number(ns, first, _right, stack, once);
			else
				apply_predicate_boolean(ns, first, _right, stack, once);
		}